

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void verb_prog_antava_touch_hand(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  long in_RSI;
  ROOM_INDEX_DATA *tomb;
  void *in_stack_fffffffffffffc48;
  void *in_stack_fffffffffffffc50;
  CHAR_DATA *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  allocator<char> *in_stack_fffffffffffffc80;
  allocator<char> *__a;
  char *in_stack_fffffffffffffc88;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_309;
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [36];
  undefined4 local_2bc;
  undefined8 local_2b8;
  undefined8 local_2b0;
  allocator<char> local_2a1;
  string local_2a0 [8];
  char_data **in_stack_fffffffffffffd68;
  _func_void_char_data_ptr *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  string *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  CQueue *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  string *in_stack_fffffffffffffdb0;
  int *args_1;
  undefined8 in_stack_fffffffffffffdb8;
  int nTimer;
  CQueue *in_stack_fffffffffffffdc0;
  string local_238 [8];
  char (*in_stack_fffffffffffffdd0) [5];
  char (*in_stack_fffffffffffffde8) [36];
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
  *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  string *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  CQueue *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  CQueue *in_stack_fffffffffffffe40;
  int *in_stack_fffffffffffffe48;
  char_data **in_stack_fffffffffffffe50;
  void **in_stack_fffffffffffffe58;
  void **in_stack_fffffffffffffe60;
  int *in_stack_fffffffffffffe68;
  allocator<char> local_171;
  string local_170 [36];
  undefined4 local_14c;
  undefined8 local_148;
  undefined8 local_140;
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [36];
  undefined4 local_94;
  undefined8 local_90;
  undefined8 local_88;
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  ROOM_INDEX_DATA *local_20;
  long local_10;
  
  nTimer = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  local_10 = in_RSI;
  local_20 = get_room_index((int)((ulong)in_stack_fffffffffffffc58 >> 0x20));
  if (*(short *)(*(long *)(local_10 + 0xa8) + 0x13a) == 0x1ce) {
    if (*(long *)(local_10 + 0x20) == 0) {
      if (*(short *)(local_10 + 0x1f8) < 7) {
        send_to_char(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      }
      else {
        act(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
            in_stack_fffffffffffffc48,0);
        act(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
            in_stack_fffffffffffffc48,0);
        act(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
            in_stack_fffffffffffffc48,0);
        if (*(short *)(*(long *)(local_10 + 0xa8) + 0x13a) == 0x1ce) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          local_88 = 0;
          local_90 = 0;
          local_94 = 3;
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[84],char_data*&,decltype(nullptr),decltype(nullptr),int>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30,
                     in_stack_fffffffffffffe28,
                     (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
                      *)in_stack_fffffffffffffe20,
                     (char (*) [84])CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                     in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe68);
          std::__cxx11::string::~string(local_78);
          std::allocator<char>::~allocator(&local_79);
          std::__cxx11::string::~string(local_40);
          std::allocator<char>::~allocator(&local_41);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[5]>
                    (in_stack_fffffffffffffdc0,nTimer,in_stack_fffffffffffffdb0,
                     (string *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     (_func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                      *)in_stack_fffffffffffffda0,
                     (char_data **)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     in_stack_fffffffffffffdd0);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator(&local_e1);
          std::__cxx11::string::~string(local_b8);
          std::allocator<char>::~allocator(&local_b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          local_140 = 0;
          local_148 = 0;
          local_14c = 0;
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[36],char_data*&,decltype(nullptr),decltype(nullptr),int>
                    ((CQueue *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                     in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                     in_stack_fffffffffffffde8,(char_data **)in_stack_fffffffffffffe20,
                     (void **)in_stack_fffffffffffffe28,(void **)in_stack_fffffffffffffe30,
                     (int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          std::__cxx11::string::~string(local_130);
          std::allocator<char>::~allocator(&local_131);
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator(&local_109);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          CQueue::AddToQueue<void(*)(char_data*,room_index_data*),char_data*&,room_index_data*&>
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                     (string *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     (_func_void_char_data_ptr_room_index_data_ptr *)in_stack_fffffffffffffd80,
                     (char_data **)in_stack_fffffffffffffd78,
                     (room_index_data **)in_stack_fffffffffffffdb0);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe67);
          std::__cxx11::string::~string(local_170);
          std::allocator<char>::~allocator(&local_171);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                    ((CQueue *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                     in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                     in_stack_fffffffffffffd68);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe17);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe3f);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffdc7;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          args_1 = (int *)0x0;
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[54],char_data*&,decltype(nullptr),decltype(nullptr),int>
                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10,
                     (string *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                     (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
                      *)in_stack_fffffffffffffe00,(char (*) [54])in_stack_fffffffffffffdf8,
                     (char_data **)in_stack_fffffffffffffe30,
                     (void **)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     (void **)in_stack_fffffffffffffe40,in_stack_fffffffffffffe48);
          std::__cxx11::string::~string(local_238);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdc7);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdef);
          __s = &stack0xfffffffffffffd87;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this,__s,in_stack_fffffffffffffc80);
          __a = &local_2a1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
          local_2b0 = 0;
          local_2b8 = 0;
          local_2bc = 0;
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[79],char_data*&,decltype(nullptr),decltype(nullptr),int>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30,
                     in_stack_fffffffffffffe28,
                     (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
                      *)in_stack_fffffffffffffe20,
                     (char (*) [79])CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                     in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe68);
          std::__cxx11::string::~string(local_2a0);
          std::allocator<char>::~allocator(&local_2a1);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffd88);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd87);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
          CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,int>
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                     (string *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     (_func_void_char_data_ptr_int *)in_stack_fffffffffffffd80,
                     (char_data **)in_stack_fffffffffffffd78,args_1);
          std::__cxx11::string::~string(local_308);
          std::allocator<char>::~allocator(&local_309);
          std::__cxx11::string::~string(local_2e0);
          std::allocator<char>::~allocator(&local_2e1);
        }
      }
    }
    else {
      send_to_char(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    }
  }
  return;
}

Assistant:

void verb_prog_antava_touch_hand(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *tomb = get_room_index(102);

	if (ch->in_room->vnum != 462)
		return;

	if (ch->fighting)
	{
		send_to_char("You're too busy fighting to do that!\n\r", ch);
		return;
	}

	if (ch->position <= POS_SITTING)
	{
		send_to_char("You can't reach it while you're sitting down.\n\r", ch);
		return;
	}

	act("You touch the hand of the decaying statue.", ch, 0, 0, TO_CHAR);
	act("$n reaches up and touches the hand of the decaying statue.", ch, 0, 0, TO_ROOM);
	act("A rusty clicking noise begins to sound from within the statue.", 0, 0, 0, TO_ROOM);

	if (ch->in_room->vnum != 462)
		return;

	RS.Queue.AddToQueue(14,"verb_prog_antava_touch_hand", "act_queue", act_queue, "Darkness closes back in upon the antechamber as the stone above you shuts abruptly!", ch, nullptr, nullptr, TO_CHAR);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "do_look_queue", do_look_queue, ch, "auto");
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "act_queue", act_queue, "$n suddenly slides down from above!", ch, nullptr, nullptr, TO_ROOM);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "char_to_room", char_to_room, ch, tomb);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "char_from_room", char_from_room, ch);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "act_queue", act_queue, "You suddenly feel the ground drop out from under you!", ch, nullptr, nullptr, TO_CHAR);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "act_queue", act_queue, "The sound of grinding granite fills the air as $n suddenly drops out of sight!", ch, nullptr, nullptr, TO_ROOM);
	RS.Queue.AddToQueue(2, "verb_prog_antava_touch_hand", "WAIT_STATE", WAIT_STATE, ch, PULSE_VIOLENCE * 5);
}